

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::Coefficients::InternalSwap(Coefficients *this,Coefficients *other)

{
  intptr_t iVar1;
  void *pvVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  LogMessage *other_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  iVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar1;
  if (this == other) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x324);
    other_00 = google::protobuf::internal::LogMessage::operator<<
                         (&local_50,"CHECK failed: this != other: ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other_00);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar5 = (this->alpha_).current_size_;
  iVar6 = (this->alpha_).total_size_;
  pvVar2 = (this->alpha_).arena_or_elements_;
  iVar4 = (other->alpha_).total_size_;
  pvVar3 = (other->alpha_).arena_or_elements_;
  (this->alpha_).current_size_ = (other->alpha_).current_size_;
  (this->alpha_).total_size_ = iVar4;
  (this->alpha_).arena_or_elements_ = pvVar3;
  (other->alpha_).current_size_ = iVar5;
  (other->alpha_).total_size_ = iVar6;
  (other->alpha_).arena_or_elements_ = pvVar2;
  return;
}

Assistant:

void Coefficients::InternalSwap(Coefficients* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  alpha_.InternalSwap(&other->alpha_);
}